

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void ecs_clear(ecs_world_t *world,ecs_entity_t entity)

{
  ecs_vector_t *vector;
  ecs_world_t *world_00;
  _Bool _Var1;
  int32_t iVar2;
  ecs_stage_t *stage;
  ecs_entity_t *peVar3;
  ecs_table_t *peVar4;
  ecs_entities_t to_remove;
  ecs_entity_info_t info;
  ecs_entity_t buffer [32];
  ecs_world_t *local_180;
  ecs_entities_t local_178;
  ecs_entity_info_t local_168;
  ecs_entities_t local_148;
  ecs_entity_t local_138 [33];
  
  local_180 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x702);
  if (world == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x702,"void ecs_clear(ecs_world_t *, ecs_entity_t)");
  }
  _ecs_assert(entity != 0,2,(char *)0x0,"entity != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x703);
  if (entity != 0) {
    stage = ecs_get_stage(&local_180);
    _Var1 = ecs_defer_clear(local_180,stage,entity);
    if (!_Var1) {
      local_168.table = (ecs_table_t *)0x0;
      ecs_get_info(local_180,entity,&local_168);
      peVar4 = local_168.table;
      if (local_168.table != (ecs_table_t *)0x0) {
        vector = (local_168.table)->type;
        peVar3 = (ecs_entity_t *)_ecs_vector_first(vector,8,0x10);
        iVar2 = ecs_vector_count(vector);
        world_00 = local_180;
        local_178.array = peVar3;
        local_178.count = iVar2;
        _ecs_assert(iVar2 < 0x20,2,(char *)0x0,"components->count < ECS_MAX_ADD_REMOVE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x596);
        if (0x1f < iVar2) {
          __assert_fail("components->count < (32)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x596,
                        "void remove_entities_w_info(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_entities_t *)"
                       );
        }
        local_148.array = local_138;
        local_148.count = 0;
        peVar4 = ecs_table_traverse_remove(world_00,peVar4,&local_178,&local_148);
        commit(world_00,entity,&local_168,peVar4,(ecs_entities_t *)0x0,&local_148);
      }
      ecs_defer_flush(local_180,stage);
    }
    return;
  }
  __assert_fail("entity != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x703,"void ecs_clear(ecs_world_t *, ecs_entity_t)");
}

Assistant:

void ecs_clear(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(entity != 0, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    if (ecs_defer_clear(world, stage, entity)) {
        return;
    }

    ecs_entity_info_t info;
    info.table = NULL;

    ecs_get_info(world, entity, &info);

    ecs_table_t *table = info.table;
    if (table) {
        ecs_type_t type = table->type;

        /* Remove all components */
        ecs_entities_t to_remove = ecs_type_to_entities(type);
        remove_entities_w_info(world, entity, &info, &to_remove);
    }    

    ecs_defer_flush(world, stage);
}